

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall
cxxopts::ParseResult::ParseResult
          (ParseResult *this,NameHashMap *keys,ParsedHashMap *values,
          vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *sequential,
          vector<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_> *default_opts,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *unmatched_args)

{
  pointer pKVar1;
  pointer pbVar2;
  
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)this,keys,keys);
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_cxxopts::OptionValue>,_std::allocator<std::pair<const_unsigned_long,_cxxopts::OptionValue>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this->m_values)._M_h,values,values);
  pKVar1 = (sequential->super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (sequential->super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = pKVar1;
  (this->m_sequential).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (sequential->super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (sequential->super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (sequential->super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (sequential->super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pKVar1 = (default_opts->super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->m_defaults).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (default_opts->super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>).
       _M_impl.super__Vector_impl_data._M_start;
  (this->m_defaults).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish = pKVar1;
  (this->m_defaults).super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (default_opts->super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (default_opts->super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (default_opts->super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (default_opts->super__Vector_base<cxxopts::KeyValue,_std::allocator<cxxopts::KeyValue>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pbVar2 = (unmatched_args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->m_unmatched).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (unmatched_args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->m_unmatched).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbVar2;
  (this->m_unmatched).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (unmatched_args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (unmatched_args->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (unmatched_args->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (unmatched_args->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

ParseResult(NameHashMap&& keys, ParsedHashMap&& values, std::vector<KeyValue> sequential,
          std::vector<KeyValue> default_opts, std::vector<std::string>&& unmatched_args)
  : m_keys(std::move(keys))
  , m_values(std::move(values))
  , m_sequential(std::move(sequential))
  , m_defaults(std::move(default_opts))
  , m_unmatched(std::move(unmatched_args))
  {
  }